

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsLink.cpp
# Opt level: O3

bool Js::ASMLink::CheckMathLibraryMethod
               (ScriptContext *scriptContext,Var asmMathObject,
               AsmJSMathBuiltinFunction mathLibMethod)

{
  code *pcVar1;
  bool bVar2;
  Var pvVar3;
  undefined4 *puVar4;
  undefined1 *funcInfo;
  PropertyId PVar5;
  double *pdVar6;
  
  switch(mathLibMethod) {
  case AsmJSMathBuiltin_sin:
    funcInfo = Math::EntryInfo::Sin;
    PVar5 = 0x2f;
    break;
  case AsmJSMathBuiltin_cos:
    funcInfo = Math::EntryInfo::Cos;
    PVar5 = 0x24;
    break;
  case AsmJSMathBuiltin_tan:
    funcInfo = Math::EntryInfo::Tan;
    PVar5 = 0x31;
    break;
  case AsmJSMathBuiltin_asin:
    funcInfo = Math::EntryInfo::Asin;
    PVar5 = 0x20;
    break;
  case AsmJSMathBuiltin_acos:
    funcInfo = Math::EntryInfo::Acos;
    PVar5 = 0x1e;
    break;
  case AsmJSMathBuiltin_atan:
    funcInfo = Math::EntryInfo::Atan;
    PVar5 = 0x21;
    break;
  case AsmJSMathBuiltin_ceil:
    funcInfo = Math::EntryInfo::Ceil;
    PVar5 = 0x23;
    break;
  case AsmJSMathBuiltin_floor:
    funcInfo = Math::EntryInfo::Floor;
    PVar5 = 0x26;
    break;
  case AsmJSMathBuiltin_exp:
    funcInfo = Math::EntryInfo::Exp;
    PVar5 = 0x25;
    break;
  case AsmJSMathBuiltin_log:
    funcInfo = Math::EntryInfo::Log;
    PVar5 = 0x27;
    break;
  case AsmJSMathBuiltin_pow:
    funcInfo = Math::EntryInfo::Pow;
    PVar5 = 0x2c;
    break;
  case AsmJSMathBuiltin_sqrt:
    funcInfo = Math::EntryInfo::Sqrt;
    PVar5 = 0x30;
    break;
  case AsmJSMathBuiltin_abs:
    funcInfo = Math::EntryInfo::Abs;
    PVar5 = 0x1d;
    break;
  case AsmJSMathBuiltin_atan2:
    funcInfo = Math::EntryInfo::Atan2;
    PVar5 = 0x22;
    break;
  case AsmJSMathBuiltin_imul:
    funcInfo = Math::EntryInfo::Imul;
    PVar5 = 0x40;
    break;
  case AsmJSMathBuiltin_fround:
    funcInfo = Math::EntryInfo::Fround;
    PVar5 = 0x42;
    break;
  case AsmJSMathBuiltin_min:
    funcInfo = Math::EntryInfo::Min;
    PVar5 = 0x2a;
    break;
  case AsmJSMathBuiltin_max:
    funcInfo = Math::EntryInfo::Max;
    PVar5 = 0xfe;
    break;
  case AsmJSMathBuiltin_clz32:
    funcInfo = Math::EntryInfo::Clz32;
    PVar5 = 0x41;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsLink.cpp"
                                ,0xa3,"((0))","(0)");
    if (bVar2) {
      *puVar4 = 0;
      return false;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case AsmJSMathBuiltin_e:
    pdVar6 = (double *)&Math::E;
    PVar5 = 0x75;
    goto LAB_009451e9;
  case AsmJSMathBuiltin_ln10:
    pdVar6 = (double *)&Math::LN10;
    PVar5 = 0xd3;
    goto LAB_009451e9;
  case AsmJSMathBuiltin_ln2:
    pdVar6 = (double *)&Math::LN2;
    PVar5 = 0xd4;
    goto LAB_009451e9;
  case AsmJSMathBuiltin_log2e:
    pdVar6 = (double *)&Math::LOG2E;
    PVar5 = 0x29;
    goto LAB_009451e9;
  case AsmJSMathBuiltin_log10e:
    pdVar6 = (double *)&Math::LOG10E;
    PVar5 = 0x28;
    goto LAB_009451e9;
  case AsmJSMathBuiltin_pi:
    pdVar6 = (double *)&Math::PI;
    PVar5 = 0x2b;
    goto LAB_009451e9;
  case AsmJSMathBuiltin_sqrt1_2:
    pdVar6 = (double *)&Math::SQRT1_2;
    PVar5 = 0x157;
    goto LAB_009451e9;
  case AsmJSMathBuiltin_sqrt2:
    pdVar6 = (double *)&Math::SQRT2;
    PVar5 = 0x158;
LAB_009451e9:
    pvVar3 = JavascriptOperators::OP_GetProperty(asmMathObject,PVar5,scriptContext);
    return (double)((ulong)pvVar3 ^ 0xfffc000000000000) == *pdVar6 && (ulong)pvVar3 >> 0x32 != 0;
  }
  bVar2 = CheckIsBuiltinFunction(scriptContext,asmMathObject,PVar5,(FunctionInfo *)funcInfo);
  return bVar2;
}

Assistant:

bool ASMLink::CheckMathLibraryMethod(ScriptContext* scriptContext, const Var asmMathObject, const AsmJSMathBuiltinFunction mathLibMethod)
    {
        switch (mathLibMethod)
        {
#define ASMJS_MATH_FUNC_NAMES(name, propertyName, funcInfo) case AsmJSMathBuiltinFunction::AsmJSMathBuiltin_##name: \
            return CheckIsBuiltinFunction(scriptContext, asmMathObject, PropertyIds::##propertyName, funcInfo);
#include "AsmJsBuiltInNames.h"
#define ASMJS_MATH_DOUBLE_CONST_NAMES(name, propertyName, value) case AsmJSMathBuiltinFunction::AsmJSMathBuiltin_##name: \
            return CheckIsBuiltinValue(scriptContext, asmMathObject, PropertyIds::##propertyName, value);
#include "AsmJsBuiltInNames.h"
        default:
            Assume(UNREACHED);
        }
        return false;
    }